

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void * RunCPQExperiment(void *threadarg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint64_t uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint seed;
  uint local_54;
  string local_50;
  
  local_54 = 0;
  uVar2 = rdtsc();
  iVar4 = (int)(10000000 / (long)threadsCount);
  if (0 < iVar4) {
    uVar6 = 10000000 / (long)threadsCount & 0xffffffff;
    do {
      iVar3 = rand_r(&local_54);
      CircularPriorityQueue<int>::push(cpq,iVar3 % 1000000);
      uVar5 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"INSERT","");
  saveThroughput(&local_50,*threadarg,uVar2,(long)iVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pthread_barrier_wait((pthread_barrier_t *)&barrier);
  uVar2 = rdtsc();
  iVar4 = (int)(5000000 / (long)threadsCount);
  if (0 < iVar4) {
    uVar6 = 5000000 / (long)threadsCount & 0xffffffff;
    do {
      CircularPriorityQueue<int>::pop(cpq);
      uVar5 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"DELETE","");
  saveThroughput(&local_50,*threadarg,uVar2,(long)iVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pthread_barrier_wait((pthread_barrier_t *)&barrier);
  local_54 = 0;
  uVar2 = rdtsc();
  iVar4 = (int)(4000000 / (long)threadsCount);
  if (0 < iVar4) {
    uVar6 = 4000000 / (long)threadsCount & 0xffffffff;
    do {
      iVar3 = rand_r(&local_54);
      if (iVar3 * -0x55555555 + 0x2aaaaaaaU < 0x55555555) {
        CircularPriorityQueue<int>::pop(cpq);
      }
      else {
        iVar3 = rand_r(&local_54);
        CircularPriorityQueue<int>::push(cpq,iVar3 % 1000000);
      }
      uVar5 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"RANDOM","");
  saveThroughput(&local_50,*threadarg,uVar2,(long)iVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return (void *)0x0;
}

Assistant:

void *RunCPQExperiment(void *threadarg) {
    struct threadData *threadData;
    threadData = (struct threadData *) threadarg;


    unsigned int seed = 0;
    int operationsCount = INSERT_ELEMENTS / threadsCount;

    uint64_t start = __rdtsc();
    for (int i = 0; i < operationsCount; ++i) {
        int insertedNum = rand_r(&seed) % MAX_INSERTED_NUM;
        cpq->push(insertedNum);
    }
    saveThroughput("INSERT", threadData->threadId, start, operationsCount);

    pthread_barrier_wait(&barrier);
    operationsCount = DELETE_ELEMENTS / threadsCount;
    start = __rdtsc();
    for (int i = 0; i < operationsCount; ++i) {
        cpq->pop();
    }
    saveThroughput("DELETE", threadData->threadId, start, operationsCount);

    pthread_barrier_wait(&barrier);
    seed = 0;
    operationsCount = RANDOM_ELEMENTS / threadsCount;
    start = __rdtsc();
    for (int i = 0; i < operationsCount; ++i) {
        int mode = rand_r(&seed) % 3;
        if (mode == 0) {
            cpq->pop();
        } else {
            int insertedNum = rand_r(&seed) % MAX_INSERTED_NUM;
            cpq->push(insertedNum);
        }
    }
    saveThroughput("RANDOM", threadData->threadId, start, operationsCount);

    return nullptr;
}